

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<unsigned_int,_unsigned_int>::sort
          (ParallelRadixSort<unsigned_int,_unsigned_int> *this,size_t blockSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t numTasks;
  
  uVar3 = *(ulong *)(this + 0x18);
  if (blockSize < uVar3) {
    uVar2 = ((uVar3 + blockSize) - 1) / blockSize;
    iVar1 = tbb::detail::d1::max_concurrency();
    uVar3 = (long)iVar1;
    if (uVar2 < (ulong)(long)iVar1) {
      uVar3 = uVar2;
    }
    numTasks = 0x40;
    if (uVar3 < 0x40) {
      numTasks = uVar3;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  std::
  __sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_int_const&,unsigned_int_const&)>>
            (*(uint **)(this + 8),*(uint **)(this + 8) + uVar3,
             (_Iter_comp_iter<bool_(*)(const_unsigned_int_&,_const_unsigned_int_&)>)0x153a8a);
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }